

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int expand(archive_read *a,int64_t *end)

{
  byte bVar1;
  void *pvVar2;
  undefined8 uVar3;
  bool bVar4;
  archive_read *a_00;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint32_t uVar9;
  uint uVar10;
  uint8_t *puVar11;
  undefined4 extraout_var;
  byte *pbVar12;
  rar_program_code *prog;
  undefined8 *__ptr;
  uint uVar13;
  ulong uVar14;
  uint8_t uVar15;
  long *plVar16;
  uint uVar17;
  ulong uVar18;
  void *pvVar19;
  size_t __size;
  void *pvVar20;
  uint64_t uVar21;
  ulong uVar22;
  size_t sVar23;
  undefined1 uVar24;
  uint uVar25;
  long *plVar26;
  int iVar27;
  uint uVar28;
  long lVar29;
  uint uVar30;
  uint8_t flags;
  memory_bit_reader br;
  byte local_13a;
  byte local_139;
  archive_read *local_138;
  ulong local_130;
  memory_bit_reader local_128;
  rar_br *local_100;
  uint32_t local_f4;
  long *local_f0;
  memory_bit_reader local_e8;
  undefined8 local_b8;
  void *local_b0;
  uint8_t *local_a8;
  long local_a0;
  undefined8 *local_98;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  byte *local_60;
  huffman_code *local_58;
  void *local_50;
  huffman_code *local_48;
  huffman_code *local_40;
  huffman_code *local_38;
  
  pvVar2 = a->format->data;
  if (*(long *)((long)pvVar2 + 0x3a8) < *end) {
    *end = *(long *)((long)pvVar2 + 0x3a8);
  }
  lVar29 = *(long *)((long)pvVar2 + 0x360);
  if (lVar29 < *end) {
    if (*(char *)((long)pvVar2 + 0x3d2) == '\0') {
      local_100 = (rar_br *)((long)pvVar2 + 0x4f30);
      local_38 = (huffman_code *)((long)pvVar2 + 0x118);
      local_48 = (huffman_code *)((long)pvVar2 + 0x140);
      local_58 = (huffman_code *)((long)pvVar2 + 0x168);
      local_90 = (undefined8 *)((long)pvVar2 + 0x370);
      local_40 = (huffman_code *)((long)pvVar2 + 400);
      local_98 = (undefined8 *)((long)pvVar2 + 0x374);
      local_138 = a;
      local_f0 = end;
      do {
        a_00 = local_138;
        iVar6 = read_next_symbol(local_138,local_38);
        if (iVar6 < 0) {
          return -0x1e;
        }
        if (iVar6 < 0x100) {
          *(char *)(*(long *)((long)pvVar2 + 0x350) +
                   (long)(int)(*(uint *)((long)pvVar2 + 0x358) & *(uint *)((long)pvVar2 + 0x360))) =
               (char)iVar6;
          *(long *)((long)pvVar2 + 0x360) = *(long *)((long)pvVar2 + 0x360) + 1;
        }
        else if (iVar6 == 0x102) {
          uVar25 = *(uint *)((long)pvVar2 + 0x368);
          if (uVar25 != 0) {
            iVar27 = *(int *)((long)pvVar2 + 0x36c);
LAB_0024a73e:
            *(int *)((long)pvVar2 + 0x36c) = iVar27;
            *(uint *)((long)pvVar2 + 0x368) = uVar25;
            if (0 < (int)uVar25) {
              uVar10 = *(uint *)((long)pvVar2 + 0x360) & *(uint *)((long)pvVar2 + 0x358);
              uVar28 = uVar10 - iVar27 & *(uint *)((long)pvVar2 + 0x358);
              uVar13 = uVar25;
              do {
                uVar30 = uVar28;
                if ((int)uVar28 < (int)uVar10) {
                  uVar30 = uVar10;
                }
                uVar30 = (*(int *)((long)pvVar2 + 0x358) - uVar30) + 1;
                if ((int)uVar13 < (int)uVar30) {
                  uVar30 = uVar13;
                }
                pvVar20 = (void *)((long)(int)uVar10 + *(long *)((long)pvVar2 + 0x350));
                pvVar19 = (void *)(*(long *)((long)pvVar2 + 0x350) + (long)(int)uVar28);
                if (((int)(uVar30 + uVar10) < (int)uVar28) || ((int)(uVar30 + uVar28) < (int)uVar10)
                   ) {
                  memcpy(pvVar20,pvVar19,(long)(int)uVar30);
                }
                else if (0 < (int)uVar30) {
                  uVar14 = 0;
                  do {
                    *(undefined1 *)((long)pvVar20 + uVar14) =
                         *(undefined1 *)((long)pvVar19 + uVar14);
                    uVar14 = uVar14 + 1;
                  } while (uVar30 != uVar14);
                }
                uVar10 = uVar30 + uVar10 & *(uint *)((long)pvVar2 + 0x358);
                uVar28 = uVar30 + uVar28 & *(uint *)((long)pvVar2 + 0x358);
                uVar17 = uVar13 - uVar30;
                bVar4 = (int)uVar30 <= (int)uVar13;
                uVar13 = uVar17;
              } while (uVar17 != 0 && bVar4);
            }
            *(long *)((long)pvVar2 + 0x360) = *(long *)((long)pvVar2 + 0x360) + (long)(int)uVar25;
            end = local_f0;
          }
        }
        else {
          if (iVar6 != 0x101) {
            if (iVar6 == 0x100) {
              if (((*(int *)((long)pvVar2 + 0x4f38) < 1) &&
                  (iVar6 = rar_br_fillup(local_138,local_100), iVar6 == 0)) &&
                 (*(int *)((long)pvVar2 + 0x4f38) < 1)) {
LAB_0024abb9:
                archive_set_error(&local_138->archive,0x54,"Truncated RAR file data");
                *(undefined1 *)((long)pvVar2 + 0xd0) = 0;
                return -0x1e;
              }
              iVar6 = *(int *)((long)pvVar2 + 0x4f38);
              uVar13 = iVar6 - 1;
              *(uint *)((long)pvVar2 + 0x4f38) = uVar13;
              if ((*(ulong *)((long)pvVar2 + 0x4f30) >> ((ulong)uVar13 & 0x3f) & 1) == 0) {
                *(undefined1 *)((long)pvVar2 + 0xec) = 1;
                if (((1 < iVar6) || (iVar6 = rar_br_fillup(local_138,local_100), iVar6 != 0)) ||
                   (0 < *(int *)((long)pvVar2 + 0x4f38))) {
                  uVar13 = *(int *)((long)pvVar2 + 0x4f38) - 1;
                  *(bool *)((long)pvVar2 + 0x388) =
                       (*(ulong *)((long)pvVar2 + 0x4f30) >> ((ulong)uVar13 & 0x3f) & 1) != 0;
                  *(uint *)((long)pvVar2 + 0x4f38) = uVar13;
                  *local_f0 = *(long *)((long)pvVar2 + 0x360);
                  return 0;
                }
                goto LAB_0024abb9;
              }
              iVar6 = parse_codes(local_138);
              end = local_f0;
              if (iVar6 != 0) {
                return -0x1e;
              }
              goto LAB_0024a7f4;
            }
            if (iVar6 < 0x107) {
              uVar14 = (ulong)(iVar6 - 0x103);
              iVar27 = *(int *)((long)pvVar2 + uVar14 * 4 + 0x370);
              uVar13 = read_next_symbol(a_00,local_40);
              if (0x1b < uVar13) goto LAB_0024ab82;
              uVar25 = ""[uVar13] + 2;
              if (7 < uVar13) {
                bVar5 = ""[uVar13];
                uVar13 = (uint)bVar5;
                if (*(int *)((long)pvVar2 + 0x4f38) < (int)(uint)bVar5) {
                  local_130 = CONCAT44(local_130._4_4_,(uint)bVar5);
                  iVar7 = rar_br_fillup(local_138,local_100);
                  uVar13 = (uint)local_130;
                  if ((iVar7 == 0) && (*(int *)((long)pvVar2 + 0x4f38) < (int)(uint)local_130))
                  goto LAB_0024abb9;
                }
                iVar7 = *(int *)((long)pvVar2 + 0x4f38) - uVar13;
                uVar25 = ((uint)(*(ulong *)((long)pvVar2 + 0x4f30) >> ((byte)iVar7 & 0x3f)) &
                         cache_masks[uVar13]) + uVar25;
                *(int *)((long)pvVar2 + 0x4f38) = iVar7;
              }
              if (0x103 < iVar6) {
                do {
                  *(undefined4 *)((long)pvVar2 + uVar14 * 4 + 0x370) =
                       *(undefined4 *)((long)pvVar2 + uVar14 * 4 + 0x36c);
                  bVar4 = 1 < (long)uVar14;
                  uVar14 = uVar14 - 1;
                } while (bVar4);
              }
            }
            else {
              if (iVar6 < 0x10f) {
                bVar5 = ""[iVar6 - 0x107U];
                bVar1 = "\x02\x02\x03\x04\x05\x06\x06\x06"[iVar6 - 0x107U];
                if (((*(int *)((long)pvVar2 + 0x4f38) < (int)(uint)bVar1) &&
                    (iVar6 = rar_br_fillup(local_138,local_100), iVar6 == 0)) &&
                   (*(int *)((long)pvVar2 + 0x4f38) < (int)(uint)bVar1)) goto LAB_0024abb9;
                uVar14 = *(ulong *)((long)pvVar2 + 0x4f30);
                iVar6 = *(int *)((long)pvVar2 + 0x4f38) - (uint)bVar1;
                *(int *)((long)pvVar2 + 0x4f38) = iVar6;
                uVar3 = *local_90;
                *(undefined4 *)(local_98 + 1) = *(undefined4 *)(local_90 + 1);
                *local_98 = uVar3;
                iVar27 = ((uint)(uVar14 >> ((byte)iVar6 & 0x3f)) & cache_masks[bVar1]) + bVar5 + 1;
                *(int *)((long)pvVar2 + 0x370) = iVar27;
                uVar25 = 2;
                goto LAB_0024a73e;
              }
              if (0x12a < iVar6) {
LAB_0024ab82:
                archive_set_error(&local_138->archive,0x54,"Bad RAR file data");
                return -0x1e;
              }
              uVar13 = iVar6 - 0x10f;
              iVar6 = ""[uVar13] + 3;
              if (7 < uVar13) {
                bVar5 = ""[uVar13];
                if (((*(int *)((long)pvVar2 + 0x4f38) < (int)(uint)bVar5) &&
                    (iVar27 = rar_br_fillup(local_138,local_100), iVar27 == 0)) &&
                   (*(int *)((long)pvVar2 + 0x4f38) < (int)(uint)bVar5)) goto LAB_0024abb9;
                iVar27 = *(int *)((long)pvVar2 + 0x4f38) - (uint)bVar5;
                iVar6 = ((uint)(*(ulong *)((long)pvVar2 + 0x4f30) >> ((byte)iVar27 & 0x3f)) &
                        cache_masks[bVar5]) + iVar6;
                *(int *)((long)pvVar2 + 0x4f38) = iVar27;
              }
              uVar13 = read_next_symbol(local_138,local_48);
              if (0x3b < uVar13) goto LAB_0024ab82;
              uVar14 = (ulong)uVar13;
              iVar27 = expand::offsetbases[uVar14] + 1;
              if (3 < uVar13) {
                bVar5 = ""[uVar14];
                if ((int)uVar13 < 10) {
                  if (((*(int *)((long)pvVar2 + 0x4f38) < (int)(uint)bVar5) &&
                      (iVar7 = rar_br_fillup(local_138,local_100), iVar7 == 0)) &&
                     (*(int *)((long)pvVar2 + 0x4f38) < (int)(uint)bVar5)) goto LAB_0024abb9;
                  iVar7 = *(int *)((long)pvVar2 + 0x4f38) - (uint)bVar5;
                  iVar27 = ((uint)(*(ulong *)((long)pvVar2 + 0x4f30) >> ((byte)iVar7 & 0x3f)) &
                           cache_masks[bVar5]) + iVar27;
                  *(int *)((long)pvVar2 + 0x4f38) = iVar7;
                }
                else {
                  if (uVar14 - 0xc < 0x30) {
                    iVar7 = bVar5 - 4;
                    if (((*(int *)((long)pvVar2 + 0x4f38) < iVar7) &&
                        (iVar8 = rar_br_fillup(local_138,local_100), iVar8 == 0)) &&
                       (*(int *)((long)pvVar2 + 0x4f38) < iVar7)) goto LAB_0024abb9;
                    iVar7 = *(int *)((long)pvVar2 + 0x4f38) - iVar7;
                    iVar27 = ((uint)(*(ulong *)((long)pvVar2 + 0x4f30) >> ((byte)iVar7 & 0x3f)) &
                             *(uint *)("\x02\x02\x03\x04\x05\x06\x06\x06" + (ulong)bVar5 * 4 + 2)) *
                             0x10 + iVar27;
                    *(int *)((long)pvVar2 + 0x4f38) = iVar7;
                  }
                  if (*(int *)((long)pvVar2 + 900) == 0) {
                    iVar7 = read_next_symbol(local_138,local_58);
                    if (iVar7 < 0) {
                      return -0x1e;
                    }
                    if (iVar7 != 0x10) {
                      iVar27 = iVar27 + iVar7;
                      *(int *)((long)pvVar2 + 0x380) = iVar7;
                      goto LAB_0024a6fd;
                    }
                    *(undefined4 *)((long)pvVar2 + 900) = 0xf;
                  }
                  else {
                    *(int *)((long)pvVar2 + 900) = *(int *)((long)pvVar2 + 900) + -1;
                  }
                  iVar27 = iVar27 + *(int *)((long)pvVar2 + 0x380);
                }
              }
LAB_0024a6fd:
              uVar3 = *local_90;
              *(undefined4 *)(local_98 + 1) = *(undefined4 *)(local_90 + 1);
              *local_98 = uVar3;
              uVar25 = iVar6 + (uint)(0x3ffff < iVar27) + (uint)(0x1fff < iVar27);
            }
            *(int *)((long)pvVar2 + 0x370) = iVar27;
            goto LAB_0024a73e;
          }
          pvVar19 = a_00->format->data;
          iVar6 = rar_decode_byte(a_00,&local_139);
          if (iVar6 == 0) {
            return -0x1e;
          }
          local_130 = CONCAT44(local_130._4_4_,(uint)local_139);
          uVar13 = (local_139 & 7) + 1;
          if ((char)uVar13 == '\a') {
            iVar6 = rar_decode_byte(a_00,&local_13a);
            if (iVar6 == 0) {
              return -0x1e;
            }
            uVar13 = local_13a + 7;
          }
          else if ((char)uVar13 == '\b') {
            iVar6 = rar_decode_byte(a_00,&local_13a);
            bVar5 = local_13a;
            if (iVar6 == 0) {
              return -0x1e;
            }
            iVar6 = rar_decode_byte(a_00,&local_13a);
            if (iVar6 == 0) {
              return -0x1e;
            }
            uVar13 = (uint)CONCAT11(bVar5,local_13a);
          }
          uVar18 = (ulong)uVar13;
          puVar11 = (uint8_t *)malloc(uVar18);
          local_50 = pvVar19;
          local_a8 = puVar11;
          uVar14 = uVar18;
          if (puVar11 == (uint8_t *)0x0) {
            return -0x1e;
          }
          for (; uVar14 != 0; uVar14 = uVar14 - 1) {
            iVar6 = rar_decode_byte(a_00,puVar11);
            if (iVar6 == 0) goto LAB_0024aba7;
            puVar11 = puVar11 + 1;
          }
          pvVar19 = a_00->format->data;
          local_128.offset = 0;
          local_128.bits = 0;
          local_128.available = 0;
          local_128.at_eof = 0;
          local_78 = 0;
          uStack_70 = 0;
          local_88 = 0;
          uStack_80 = 0;
          uVar13 = 0;
          for (lVar29 = *(long *)((long)pvVar19 + 0x398); lVar29 != 0;
              lVar29 = *(long *)(lVar29 + 0x30)) {
            uVar13 = uVar13 + 1;
          }
          local_128.bytes = local_a8;
          local_128.length = uVar18;
          local_b0 = pvVar19;
          if ((char)local_130 < '\0') {
            uVar9 = membr_next_rarvm_number(&local_128);
            if (uVar9 == 0) {
              delete_filter(*(rar_filter **)((long)pvVar19 + 0x3a0));
              uVar25 = 0;
              *(undefined8 *)((long)pvVar19 + 0x3a0) = 0;
              delete_program_code(*(rar_program_code **)((long)pvVar19 + 0x398));
              *(undefined8 *)((long)pvVar19 + 0x398) = 0;
            }
            else {
              uVar25 = uVar9 - 1;
            }
            if (uVar13 < uVar25) goto LAB_0024aba7;
            *(uint *)((long)local_b0 + 0x3b0) = uVar25;
          }
          else {
            uVar25 = *(uint *)((long)pvVar19 + 0x3b0);
          }
          plVar26 = (long *)((long)local_b0 + 0x398);
          prog = (rar_program_code *)*plVar26;
          for (; uVar25 != 0; uVar25 = uVar25 - 1) {
            prog = prog->next;
          }
          if (prog != (rar_program_code *)0x0) {
            prog->usagecount = prog->usagecount + 1;
          }
          uVar9 = membr_next_rarvm_number(&local_128);
          local_a0 = *(long *)((long)local_b0 + 0x360) + 0x102;
          if ((local_130 & 0x40) == 0) {
            local_a0 = *(long *)((long)local_b0 + 0x360);
          }
          local_a0 = local_a0 + (ulong)uVar9;
          if ((local_130 & 0x20) == 0) {
            if (prog == (rar_program_code *)0x0) {
              local_f4 = 0;
            }
            else {
              local_f4 = prog->oldfilterlength;
            }
          }
          else {
            local_f4 = membr_next_rarvm_number(&local_128);
          }
          uStack_80 = CONCAT44(0x3c000,(undefined4)uStack_80);
          if (prog == (rar_program_code *)0x0) {
            uVar9 = 0;
          }
          else {
            uVar9 = prog->usagecount;
          }
          local_78 = CONCAT44(uVar9,local_f4);
          uStack_70 = CONCAT44(0x40000,(undefined4)uStack_70);
          if ((local_130 & 0x10) != 0) {
            if (local_128.available < 7) {
              uVar13 = 0;
              if (local_128.at_eof == 0) {
                iVar6 = local_128.available;
                if (local_128.offset < local_128.length) {
                  do {
                    uVar14 = local_128.offset + 1;
                    local_128.bits = (ulong)local_128.bytes[local_128.offset] | local_128.bits << 8;
                    local_128.available = iVar6 + 8;
                    local_128.offset = uVar14;
                    if (-2 < iVar6) goto LAB_0024a396;
                    iVar6 = iVar6 + 8;
                  } while (uVar14 != local_128.length);
                }
                local_128.at_eof = 1;
              }
            }
            else {
LAB_0024a396:
              iVar6 = local_128.available + -7;
              local_128.available = iVar6;
              uVar13 = (uint)(local_128.bits >> ((byte)iVar6 & 0x3f)) & 0x7f;
            }
            lVar29 = 0;
            do {
              if ((uVar13 >> ((uint)lVar29 & 0x1f) & 1) != 0) {
                uVar9 = membr_next_rarvm_number(&local_128);
                *(uint32_t *)((long)&local_88 + lVar29 * 4) = uVar9;
              }
              lVar29 = lVar29 + 1;
            } while (lVar29 != 7);
          }
          end = local_f0;
          if (prog == (rar_program_code *)0x0) {
            uVar9 = membr_next_rarvm_number(&local_128);
            if (uVar9 - 0x10001 < 0xffff0000) {
LAB_0024a8d4:
              bVar4 = false;
              prog = (rar_program_code *)0x0;
            }
            else {
              uVar14 = (ulong)uVar9;
              local_b8 = CONCAT44(extraout_var,uVar9);
              pbVar12 = (byte *)malloc(uVar14);
              if (pbVar12 == (byte *)0x0) goto LAB_0024a8d4;
              if ((uint)local_b8 != 0) {
                uVar18 = 0;
                uVar21 = local_128.bits;
                sVar23 = local_128.offset;
                iVar6 = local_128.available;
                iVar27 = local_128.at_eof;
                do {
                  if (iVar6 < 8) {
                    if (iVar27 == 0) {
                      uVar22 = sVar23;
                      iVar7 = iVar6;
                      if (sVar23 < local_128.length) {
                        do {
                          sVar23 = uVar22 + 1;
                          uVar21 = (ulong)local_128.bytes[uVar22] | uVar21 << 8;
                          iVar6 = iVar7 + 8;
                          local_128.available = iVar6;
                          local_128.offset = sVar23;
                          local_128.bits = uVar21;
                          if (-1 < iVar7) goto LAB_0024a49a;
                          uVar22 = sVar23;
                          iVar7 = iVar6;
                        } while (local_128.length != sVar23);
                      }
                      local_128.at_eof = 1;
                      iVar27 = 1;
                    }
                    bVar5 = 0;
                  }
                  else {
LAB_0024a49a:
                    iVar6 = iVar6 + -8;
                    local_128.available = iVar6;
                    bVar5 = (byte)(uVar21 >> ((byte)iVar6 & 0x3f));
                  }
                  pbVar12[uVar18] = bVar5;
                  uVar18 = uVar18 + 1;
                } while (uVar18 != uVar14);
              }
              local_e8.offset = 0;
              local_e8.bits = 0;
              local_e8.bytes = (byte *)0x0;
              local_e8.length = 0;
              local_e8.available = 0;
              local_e8.at_eof = 0;
              if ((uint)local_b8 < 2) {
                bVar5 = 0;
              }
              else {
                uVar18 = 1;
                bVar5 = 0;
                do {
                  bVar5 = bVar5 ^ pbVar12[uVar18];
                  uVar18 = uVar18 + 1;
                } while (uVar14 != uVar18);
              }
              local_60 = pbVar12;
              if (((uint)local_b8 == 0) || (bVar5 != *pbVar12)) {
LAB_0024a8a8:
                prog = (rar_program_code *)0x0;
              }
              else {
                local_e8.offset = 1;
                local_e8.bytes = pbVar12;
                local_e8.length = uVar14;
                prog = (rar_program_code *)calloc(1,0x38);
                if (prog == (rar_program_code *)0x0) goto LAB_0024a8a8;
                uVar18 = crc32(0,pbVar12,local_b8);
                prog->fingerprint = uVar14 << 0x20 | uVar18;
                if (local_e8.available < 1) {
                  if (local_e8.at_eof == 0) {
                    iVar6 = local_e8.available;
                    if (local_e8.offset < local_e8.length) {
                      do {
                        uVar14 = local_e8.offset + 1;
                        local_e8.bits = (ulong)local_e8.bytes[local_e8.offset] | local_e8.bits << 8;
                        local_e8.available = iVar6 + 8;
                        local_e8.offset = uVar14;
                        if (-8 < iVar6) goto LAB_0024a5c0;
                        iVar6 = iVar6 + 8;
                      } while (uVar14 != local_e8.length);
                    }
                    local_e8.at_eof = 1;
                  }
                }
                else {
LAB_0024a5c0:
                  uVar13 = local_e8.available - 1;
                  local_e8.available = uVar13;
                  if ((local_e8.bits >> ((ulong)uVar13 & 0x3f) & 1) != 0) {
                    uVar9 = membr_next_rarvm_number(&local_e8);
                    uVar13 = uVar9 + 1;
                    prog->staticdatalen = uVar13;
                    puVar11 = (uint8_t *)malloc((ulong)uVar13);
                    prog->staticdata = puVar11;
                    if (puVar11 == (uint8_t *)0x0) {
                      delete_program_code(prog);
                      goto LAB_0024a8a8;
                    }
                    if (uVar13 != 0) {
                      uVar14 = 0;
                      do {
                        if (local_e8.available < 8) {
                          if (local_e8.at_eof == 0) {
                            iVar6 = local_e8.available;
                            if (local_e8.offset < local_e8.length) {
                              do {
                                uVar18 = local_e8.offset + 1;
                                local_e8.bits =
                                     (ulong)local_e8.bytes[local_e8.offset] | local_e8.bits << 8;
                                local_e8.available = iVar6 + 8;
                                local_e8.offset = uVar18;
                                if (-1 < iVar6) goto LAB_0024a694;
                                iVar6 = iVar6 + 8;
                              } while (uVar18 != local_e8.length);
                            }
                            local_e8.at_eof = 1;
                          }
                          uVar15 = '\0';
                        }
                        else {
LAB_0024a694:
                          iVar6 = local_e8.available + -8;
                          local_e8.available = iVar6;
                          uVar15 = (uint8_t)(local_e8.bits >> ((byte)iVar6 & 0x3f));
                        }
                        prog->staticdata[uVar14] = uVar15;
                        uVar14 = uVar14 + 1;
                      } while (uVar14 < prog->staticdatalen);
                    }
                  }
                }
              }
              free(local_60);
              if (prog == (rar_program_code *)0x0) goto LAB_0024a8d4;
              do {
                plVar16 = plVar26;
                lVar29 = *plVar16;
                plVar26 = (long *)(lVar29 + 0x30);
              } while (lVar29 != 0);
              *plVar16 = (long)prog;
              bVar4 = true;
            }
            if (!bVar4) goto LAB_0024aba7;
          }
          prog->oldfilterlength = local_f4;
          if ((local_130 & 8) == 0) {
            uVar14 = 0;
            pvVar19 = (void *)0x0;
          }
          else {
            uVar9 = membr_next_rarvm_number(&local_128);
            if (0x1fc0 < uVar9) goto LAB_0024aba7;
            uVar14 = (ulong)uVar9;
            pvVar19 = malloc((ulong)(uVar9 + 0x40));
            if (pvVar19 == (void *)0x0) goto LAB_0024aba7;
            if (uVar9 != 0) {
              uVar18 = 0;
              uVar21 = local_128.bits;
              sVar23 = local_128.offset;
              iVar6 = local_128.available;
              iVar27 = local_128.at_eof;
              do {
                if (iVar6 < 8) {
                  if (iVar27 == 0) {
                    uVar22 = sVar23;
                    iVar7 = iVar6;
                    end = local_f0;
                    if (sVar23 < local_128.length) {
                      do {
                        sVar23 = uVar22 + 1;
                        uVar21 = (ulong)local_128.bytes[uVar22] | uVar21 << 8;
                        iVar6 = iVar7 + 8;
                        local_128.available = iVar6;
                        local_128.offset = sVar23;
                        local_128.bits = uVar21;
                        if (-1 < iVar7) goto LAB_0024a9b6;
                        uVar22 = sVar23;
                        iVar7 = iVar6;
                      } while (local_128.length != sVar23);
                    }
                    local_128.at_eof = 1;
                    iVar27 = 1;
                    uVar24 = 0;
                  }
                  else {
                    uVar24 = 0;
                  }
                }
                else {
LAB_0024a9b6:
                  iVar6 = iVar6 + -8;
                  local_128.available = iVar6;
                  uVar24 = (undefined1)(uVar21 >> ((byte)iVar6 & 0x3f));
                }
                *(undefined1 *)((long)pvVar19 + uVar18 + 0x40) = uVar24;
                uVar18 = uVar18 + 1;
              } while (uVar18 != uVar14);
            }
          }
          if (local_128.at_eof != 0) {
            free(pvVar19);
            goto LAB_0024aba7;
          }
          local_130 = uVar14;
          __ptr = (undefined8 *)calloc(1,0x58);
          if (__ptr == (undefined8 *)0x0) {
LAB_0024aa6d:
            __ptr = (undefined8 *)0x0;
          }
          else {
            *__ptr = prog;
            __size = 0x40;
            if (0x40 < (uint)local_130) {
              __size = local_130 & 0xffffffff;
            }
            *(int *)(__ptr + 6) = (int)__size;
            pvVar20 = calloc(1,__size);
            __ptr[5] = pvVar20;
            if (pvVar20 == (void *)0x0) {
              free(__ptr);
              goto LAB_0024aa6d;
            }
            if (pvVar19 != (void *)0x0) {
              memcpy(pvVar20,pvVar19,local_130 & 0xffffffff);
            }
            __ptr[3] = local_78;
            __ptr[4] = uStack_70;
            __ptr[1] = local_88;
            __ptr[2] = uStack_80;
            __ptr[7] = local_a0;
            *(uint32_t *)(__ptr + 8) = local_f4;
          }
          free(pvVar19);
          pvVar19 = local_50;
          if (__ptr == (undefined8 *)0x0) {
LAB_0024aba7:
            free(local_a8);
            return -0x1e;
          }
          lVar29 = 0;
          do {
            *(undefined4 *)(__ptr[5] + lVar29 * 4) = *(undefined4 *)((long)&local_88 + lVar29 * 4);
            lVar29 = lVar29 + 1;
          } while (lVar29 != 7);
          *(uint32_t *)(__ptr[5] + 0x1c) = local_f4;
          *(undefined4 *)(__ptr[5] + 0x20) = 0;
          *(uint32_t *)(__ptr[5] + 0x2c) = prog->usagecount;
          plVar26 = (long *)((long)local_b0 + 0x3a0);
          do {
            plVar16 = plVar26;
            lVar29 = *plVar16;
            plVar26 = (long *)(lVar29 + 0x50);
          } while (lVar29 != 0);
          *plVar16 = (long)__ptr;
          if (*(long *)(*(long *)((long)local_b0 + 0x3a0) + 0x50) == 0) {
            *(long *)((long)local_b0 + 0x3a8) = local_a0;
          }
          free(local_a8);
          if (*(long *)((long)pvVar19 + 0x3a8) < *end) {
            *end = *(long *)((long)pvVar19 + 0x3a8);
          }
        }
LAB_0024a7f4:
        lVar29 = *(long *)((long)pvVar2 + 0x360);
        if (*end <= lVar29) {
          return 0;
        }
      } while (*(char *)((long)pvVar2 + 0x3d2) == '\0');
    }
    *end = lVar29;
  }
  return 0;
}

Assistant:

static int
expand(struct archive_read *a, int64_t *end)
{
  static const unsigned char lengthbases[] =
    {   0,   1,   2,   3,   4,   5,   6,
        7,   8,  10,  12,  14,  16,  20,
       24,  28,  32,  40,  48,  56,  64,
       80,  96, 112, 128, 160, 192, 224 };
  static const unsigned char lengthbits[] =
    { 0, 0, 0, 0, 0, 0, 0,
      0, 1, 1, 1, 1, 2, 2,
      2, 2, 3, 3, 3, 3, 4,
      4, 4, 4, 5, 5, 5, 5 };
  static const int lengthb_min = minimum(
    (int)(sizeof(lengthbases)/sizeof(lengthbases[0])),
    (int)(sizeof(lengthbits)/sizeof(lengthbits[0]))
  );
  static const unsigned int offsetbases[] =
    {       0,       1,       2,       3,       4,       6,
            8,      12,      16,      24,      32,      48,
           64,      96,     128,     192,     256,     384,
          512,     768,    1024,    1536,    2048,    3072,
         4096,    6144,    8192,   12288,   16384,   24576,
        32768,   49152,   65536,   98304,  131072,  196608,
       262144,  327680,  393216,  458752,  524288,  589824,
       655360,  720896,  786432,  851968,  917504,  983040,
      1048576, 1310720, 1572864, 1835008, 2097152, 2359296,
      2621440, 2883584, 3145728, 3407872, 3670016, 3932160 };
  static const unsigned char offsetbits[] =
    {  0,  0,  0,  0,  1,  1,  2,  2,  3,  3,  4,  4,
       5,  5,  6,  6,  7,  7,  8,  8,  9,  9, 10, 10,
      11, 11, 12, 12, 13, 13, 14, 14, 15, 15, 16, 16,
      16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16,
      18, 18, 18, 18, 18, 18, 18, 18, 18, 18, 18, 18 };
  static const int offsetb_min = minimum(
    (int)(sizeof(offsetbases)/sizeof(offsetbases[0])),
    (int)(sizeof(offsetbits)/sizeof(offsetbits[0]))
  );
  static const unsigned char shortbases[] =
    { 0, 4, 8, 16, 32, 64, 128, 192 };
  static const unsigned char shortbits[] =
    { 2, 2, 3, 4, 5, 6, 6, 6 };

  int symbol, offs, len, offsindex, lensymbol, i, offssymbol, lowoffsetsymbol;
  unsigned char newfile;
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);

  if (rar->filters.filterstart < *end)
    *end = rar->filters.filterstart;

  while (1)
  {
    if(lzss_position(&rar->lzss) >= *end) {
      return (ARCHIVE_OK);
    }

    if(rar->is_ppmd_block) {
      *end = lzss_position(&rar->lzss);
      return (ARCHIVE_OK);
    }

    if ((symbol = read_next_symbol(a, &rar->maincode)) < 0)
      return (ARCHIVE_FATAL);

    if (symbol < 256)
    {
      lzss_emit_literal(rar, (uint8_t)symbol);
      continue;
    }
    else if (symbol == 256)
    {
      if (!rar_br_read_ahead(a, br, 1))
        goto truncated_data;
      newfile = !rar_br_bits(br, 1);
      rar_br_consume(br, 1);

      if(newfile)
      {
        rar->start_new_block = 1;
        if (!rar_br_read_ahead(a, br, 1))
          goto truncated_data;
        rar->start_new_table = rar_br_bits(br, 1);
        rar_br_consume(br, 1);
        *end = lzss_position(&rar->lzss);
        return (ARCHIVE_OK);
      }
      else
      {
        if (parse_codes(a) != ARCHIVE_OK)
          return (ARCHIVE_FATAL);
        continue;
      }
    }
    else if(symbol==257)
    {
      if (!read_filter(a, end))
          return (ARCHIVE_FATAL);
      continue;
    }
    else if(symbol==258)
    {
      if(rar->lastlength == 0)
        continue;

      offs = rar->lastoffset;
      len = rar->lastlength;
    }
    else if (symbol <= 262)
    {
      offsindex = symbol - 259;
      offs = rar->oldoffset[offsindex];

      if ((lensymbol = read_next_symbol(a, &rar->lengthcode)) < 0)
        goto bad_data;
      if (lensymbol >= lengthb_min)
        goto bad_data;
      len = lengthbases[lensymbol] + 2;
      if (lengthbits[lensymbol] > 0) {
        if (!rar_br_read_ahead(a, br, lengthbits[lensymbol]))
          goto truncated_data;
        len += rar_br_bits(br, lengthbits[lensymbol]);
        rar_br_consume(br, lengthbits[lensymbol]);
      }

      for (i = offsindex; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }
    else if(symbol<=270)
    {
      offs = shortbases[symbol-263] + 1;
      if(shortbits[symbol-263] > 0) {
        if (!rar_br_read_ahead(a, br, shortbits[symbol-263]))
          goto truncated_data;
        offs += rar_br_bits(br, shortbits[symbol-263]);
        rar_br_consume(br, shortbits[symbol-263]);
      }

      len = 2;

      for(i = 3; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }
    else
    {
      if (symbol-271 >= lengthb_min)
        goto bad_data;
      len = lengthbases[symbol-271]+3;
      if(lengthbits[symbol-271] > 0) {
        if (!rar_br_read_ahead(a, br, lengthbits[symbol-271]))
          goto truncated_data;
        len += rar_br_bits(br, lengthbits[symbol-271]);
        rar_br_consume(br, lengthbits[symbol-271]);
      }

      if ((offssymbol = read_next_symbol(a, &rar->offsetcode)) < 0)
        goto bad_data;
      if (offssymbol >= offsetb_min)
        goto bad_data;
      offs = offsetbases[offssymbol]+1;
      if(offsetbits[offssymbol] > 0)
      {
        if(offssymbol > 9)
        {
          if(offsetbits[offssymbol] > 4) {
            if (!rar_br_read_ahead(a, br, offsetbits[offssymbol] - 4))
              goto truncated_data;
            offs += rar_br_bits(br, offsetbits[offssymbol] - 4) << 4;
            rar_br_consume(br, offsetbits[offssymbol] - 4);
          }

          if(rar->numlowoffsetrepeats > 0)
          {
            rar->numlowoffsetrepeats--;
            offs += rar->lastlowoffset;
          }
          else
          {
            if ((lowoffsetsymbol =
              read_next_symbol(a, &rar->lowoffsetcode)) < 0)
              return (ARCHIVE_FATAL);
            if(lowoffsetsymbol == 16)
            {
              rar->numlowoffsetrepeats = 15;
              offs += rar->lastlowoffset;
            }
            else
            {
              offs += lowoffsetsymbol;
              rar->lastlowoffset = lowoffsetsymbol;
            }
          }
        }
        else {
          if (!rar_br_read_ahead(a, br, offsetbits[offssymbol]))
            goto truncated_data;
          offs += rar_br_bits(br, offsetbits[offssymbol]);
          rar_br_consume(br, offsetbits[offssymbol]);
        }
      }

      if (offs >= 0x40000)
        len++;
      if (offs >= 0x2000)
        len++;

      for(i = 3; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }

    rar->lastoffset = offs;
    rar->lastlength = len;

    lzss_emit_match(rar, rar->lastoffset, rar->lastlength);
  }
truncated_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Truncated RAR file data");
  rar->valid = 0;
  return (ARCHIVE_FATAL);
bad_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Bad RAR file data");
  return (ARCHIVE_FATAL);
}